

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall CLabelTable::DumpForUnreal(CLabelTable *this)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CDevicePage *pCVar5;
  mapped_type *pmVar6;
  size_t sVar7;
  uint uVar8;
  key_type *name;
  key_type *__k;
  char *ep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  char ln [2048];
  char *local_870;
  FILE *local_868;
  symbol_map_t *local_860;
  undefined1 local_858 [32];
  char local_838 [2056];
  
  local_860 = &this->symbols;
  local_868 = (FILE *)SJ_fopen((path *)&Options::UnrealLabelListFName_abi_cxx11_,"w");
  if (local_868 == (FILE *)0x0) {
    local_858._0_8_ = (key_type *)(local_858 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_858,Options::UnrealLabelListFName_abi_cxx11_,
               DAT_0018d480 + Options::UnrealLabelListFName_abi_cxx11_);
    Error("opening file for write",(char *)local_858._0_8_,FATAL);
    if ((key_type *)local_858._0_8_ != (key_type *)(local_858 + 0x10)) {
      operator_delete((void *)local_858._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_858._16_8_)->_M_p + 1));
    }
  }
  if (DeviceID == (char *)0x0) {
    uVar3 = 0x3fff;
  }
  else {
    pCVar5 = CDevice::GetPage(Device,0);
    uVar3 = pCVar5->Size - 1;
  }
  uVar8 = 0xffff;
  if (Options::EmitVirtualLabels == '\0') {
    uVar8 = uVar3;
  }
  getDumpOrder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_858,local_860);
  if (local_858._0_8_ != local_858._8_8_) {
    __k = (key_type *)local_858._0_8_;
    do {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
               ::at(local_860,__k);
      if ((int)pmVar6->page != 0xffffffff) {
        uVar3 = (int)pmVar6->page;
        if (Options::EmitVirtualLabels != '\0') {
          uVar3 = 0x7f80;
        }
        iVar4 = strcmp(DeviceID,"ZXSPECTRUM48");
        if ((iVar4 == 0) && ((int)uVar3 < 4)) {
          uVar3 = *(uint *)(&DAT_00169a10 + (long)(int)uVar3 * 4);
        }
        uVar2 = pmVar6->value;
        local_870 = local_838;
        if ((int)uVar3 < 0x7f00) {
          iVar4 = snprintf(local_838,0x800,"%02d",(ulong)(uVar3 & 0xff));
          local_870 = local_870 + iVar4;
        }
        *local_870 = ':';
        local_870 = local_870 + 1;
        PrintHexAlt(&local_870,uVar2 & uVar8);
        pcVar1 = local_870 + 1;
        *local_870 = ' ';
        local_870 = pcVar1;
        strcpy(pcVar1,(__k->_M_dataplus)._M_p);
        pcVar1 = local_870;
        sVar7 = strlen(local_870);
        (pcVar1 + sVar7)[0] = '\n';
        (pcVar1 + sVar7)[1] = '\0';
        fputs(local_838,local_868);
      }
      __k = __k + 1;
    } while (__k != (key_type *)local_858._8_8_);
  }
  fclose(local_868);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_858);
  return;
}

Assistant:

void CLabelTable::DumpForUnreal() {
	char ln[LINEMAX], * ep;
	FILE* FP_UnrealList;
	if (!FOPEN_ISOK(FP_UnrealList, Options::UnrealLabelListFName, "w")) {
		Error("opening file for write", Options::UnrealLabelListFName.string().c_str(), FATAL);
	}
	const int PAGE_MASK = DeviceID ? Device->GetPage(0)->Size - 1 : 0x3FFF;
	const int ADR_MASK = Options::EmitVirtualLabels ? 0xFFFF : PAGE_MASK;
	const auto order = getDumpOrder(symbols);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		int page = Options::EmitVirtualLabels ? LABEL_PAGE_OUT_OF_BOUNDS : symbol.page;
		if (!strcmp(DeviceID, "ZXSPECTRUM48") && page < 4) {	//TODO fix this properly?
			// convert pages {0, 1, 2, 3} of ZX48 into ZX128-like {ROM, 5, 2, 0}
			// this can be fooled when there were multiple devices used, Label doesn't know into
			// which device it does belong, so even ZX128 labels will be converted.
			const int fakeZx128Pages[] = {LABEL_PAGE_ROM, 5, 2, 0};
			page = fakeZx128Pages[page];
		}
		int lvalue = symbol.value & ADR_MASK;
		ep = ln;

		if (page < LABEL_PAGE_ROM) ep += SPRINTF1(ep, LINEMAX, "%02d", page&255);
		*(ep++) = ':';
		PrintHexAlt(ep, lvalue);

		*(ep++) = ' ';
		STRCPY(ep, LINEMAX-(ep-ln), name.c_str());
		STRCAT(ep, LINEMAX, "\n");
		fputs(ln, FP_UnrealList);
	}
	fclose(FP_UnrealList);
}